

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CGUIListBox.cpp
# Opt level: O0

void __thiscall irr::gui::CGUIListBox::setItem(CGUIListBox *this,u32 index,wchar_t *text,s32 icon)

{
  u32 uVar1;
  ListItem *pLVar2;
  s32 in_ECX;
  string<wchar_t> *in_RDX;
  uint in_ESI;
  undefined8 in_RDI;
  CGUIListBox *in_stack_00000010;
  undefined4 in_stack_ffffffffffffffd0;
  undefined4 in_stack_ffffffffffffffd4;
  s32 icon_00;
  s32 sVar3;
  string<wchar_t> *this_00;
  
  icon_00 = (s32)((ulong)in_RDI >> 0x20);
  uVar1 = core::array<irr::gui::CGUIListBox::ListItem>::size
                    ((array<irr::gui::CGUIListBox::ListItem> *)0x3c2f64);
  if (in_ESI < uVar1) {
    this_00 = in_RDX;
    core::array<irr::gui::CGUIListBox::ListItem>::operator[]
              ((array<irr::gui::CGUIListBox::ListItem> *)
               CONCAT44(in_stack_ffffffffffffffd4,in_stack_ffffffffffffffd0),
               (u32)((ulong)in_RDX >> 0x20));
    uVar1 = (u32)((ulong)in_RDX >> 0x20);
    core::string<wchar_t>::operator=(this_00,(wchar_t *)CONCAT44(in_ECX,in_ESI));
    sVar3 = in_ECX;
    pLVar2 = core::array<irr::gui::CGUIListBox::ListItem>::operator[]
                       ((array<irr::gui::CGUIListBox::ListItem> *)
                        CONCAT44(in_ECX,in_stack_ffffffffffffffd0),uVar1);
    pLVar2->Icon = in_ECX;
    recalculateItemHeight(in_stack_00000010);
    recalculateItemWidth((CGUIListBox *)CONCAT44(sVar3,in_ESI),icon_00);
  }
  return;
}

Assistant:

void CGUIListBox::setItem(u32 index, const wchar_t *text, s32 icon)
{
	if (index >= Items.size())
		return;

	Items[index].Text = text;
	Items[index].Icon = icon;

	recalculateItemHeight();
	recalculateItemWidth(icon);
}